

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTrace.cpp
# Opt level: O2

char * __thiscall llbuild::core::BuildEngineTrace::getRuleName(BuildEngineTrace *this,Rule *rule)

{
  char *pcVar1;
  FILE *__stream;
  iterator iVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar9;
  Rule *rule_local;
  string encoded;
  char name [64];
  
  __stream = (FILE *)this->outputPtr;
  rule_local = rule;
  iVar2 = std::
          _Hashtable<const_llbuild::core::Rule_*,_std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llbuild::core::Rule_*>,_std::hash<const_llbuild::core::Rule_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->ruleNames)._M_h,&rule_local);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    return *(char **)((long)iVar2.
                            super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_cur + 0x10);
  }
  this->numNamedRules = this->numNamedRules + 1;
  lVar8 = 0;
  snprintf(name,0x40,"R%d");
  pVar9 = std::
          _Hashtable<llbuild::core::Rule_const*,std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>,std::allocator<std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<llbuild::core::Rule_const*>,std::hash<llbuild::core::Rule_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<llbuild::core::Rule_const*&,char(&)[64]>
                    ((_Hashtable<llbuild::core::Rule_const*,std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>,std::allocator<std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<llbuild::core::Rule_const*>,std::hash<llbuild::core::Rule_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->ruleNames,&rule_local,name);
  std::__cxx11::string::string((string *)&encoded,(string *)&rule_local->key);
  pcVar1 = encoded._M_dataplus._M_p + encoded._M_string_length;
  lVar3 = 0;
  for (lVar6 = (long)encoded._M_string_length >> 2; pcVar5 = pcVar1, 0 < lVar6; lVar6 = lVar6 + -1)
  {
    if (encoded._M_dataplus._M_p[lVar8 * 4] < ' ') {
      pcVar7 = encoded._M_dataplus._M_p + -lVar3;
      goto LAB_001adcad;
    }
    if (encoded._M_dataplus._M_p[lVar8 * 4 + 1] < ' ') {
      pcVar7 = encoded._M_dataplus._M_p + (1 - lVar3);
      goto LAB_001adcad;
    }
    if (encoded._M_dataplus._M_p[lVar8 * 4 + 2] < ' ') {
      pcVar7 = encoded._M_dataplus._M_p + (2 - lVar3);
      goto LAB_001adcad;
    }
    if (encoded._M_dataplus._M_p[lVar8 * 4 + 3] < ' ') {
      pcVar7 = encoded._M_dataplus._M_p + (3 - lVar3);
      goto LAB_001adcad;
    }
    lVar3 = lVar3 + -4;
    lVar8 = lVar8 + 1;
  }
  pcVar7 = encoded._M_dataplus._M_p + -lVar3;
  lVar6 = encoded._M_string_length + lVar3;
  if (lVar6 == 1) {
LAB_001adc7b:
    if ('\x1f' < *pcVar7) {
      pcVar7 = pcVar1;
    }
  }
  else if (lVar6 == 2) {
LAB_001adc73:
    if ('\x1f' < *pcVar7) {
      pcVar7 = pcVar7 + 1;
      goto LAB_001adc7b;
    }
  }
  else {
    if (lVar6 != 3) goto LAB_001adce0;
    if ('\x1f' < encoded._M_dataplus._M_p[lVar8 * 4]) {
      pcVar7 = encoded._M_dataplus._M_p + (1 - lVar3);
      goto LAB_001adc73;
    }
  }
LAB_001adcad:
  pcVar4 = pcVar7;
  if (pcVar7 != pcVar1) {
    while (pcVar7 = pcVar7 + 1, pcVar5 = pcVar4, pcVar7 != pcVar1) {
      if ('\x1f' < *pcVar7) {
        *pcVar4 = *pcVar7;
        pcVar4 = pcVar4 + 1;
      }
    }
  }
LAB_001adce0:
  std::__cxx11::string::erase(&encoded,pcVar5,encoded._M_dataplus._M_p + encoded._M_string_length);
  fprintf(__stream,"{ \"new-rule\", \"%s\", \"%s\" },\n",name,encoded._M_dataplus._M_p);
  pcVar1 = *(char **)((long)pVar9.first.
                            super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_cur.
                            super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                     + 0x10);
  std::__cxx11::string::_M_dispose();
  return pcVar1;
}

Assistant:

const char* BuildEngineTrace::getRuleName(const Rule* rule) {
  FILE *fp = static_cast<FILE*>(outputPtr);

  // See if we have already assigned a name.
  auto it = ruleNames.find(rule);
  if (it != ruleNames.end())
    return it->second.c_str();

  // Otherwise, create a name.
  char name[64];
  snprintf(name, sizeof(name), "R%d", ++numNamedRules);
  auto result = ruleNames.emplace(rule, name);

  // Report the newly seen rule.
  // FIXME: This is currently encoding the key by merely stripping the
  // non-printable characters. Should probably encode this into a real encoding.
  std::string encoded = rule->key.str();
  encoded.erase(
                std::remove_if(encoded.begin(), encoded.end(),
                               [](char c) -> bool {
                                 return c < 32 || c > 127; }),
                encoded.end());
  fprintf(fp, "{ \"new-rule\", \"%s\", \"%s\" },\n", name, encoded.c_str());

  return result.first->second.c_str();
}